

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cpp
# Opt level: O3

void __thiscall
Validator_cImportThatIllustratesBadPractice_Test::~Validator_cImportThatIllustratesBadPractice_Test
          (Validator_cImportThatIllustratesBadPractice_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Validator, cImportThatIllustratesBadPractice)
{
    auto parser = libcellml::Parser::create();
    auto validator = libcellml::Validator::create();
    auto importer = libcellml::Importer::create();

    auto model = parser->parseModel(fileContents("importer/importing_bad_design_c_shape_import_hierarchy.cellml"));
    EXPECT_EQ(size_t(0), parser->issueCount());

    validator->validateModel(model);
    EXPECT_EQ(size_t(0), validator->issueCount());

    importer->resolveImports(model, resourcePath("importer/"));
    EXPECT_EQ(size_t(0), importer->issueCount());

    validator->validateModel(model);
    EXPECT_EQ(size_t(0), validator->errorCount());
}